

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::Calc_Sxi_xi_compact
          (ChElementBeamANCF_3243 *this,VectorN *Sxi_xi_compact,double xi,double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = xi;
  auVar3 = auVar4._0_16_;
  auVar1 = vfmadd213sd_fma(auVar3,auVar3,ZEXT816(0xbff0000000000000));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = xi * 3.0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = xi + xi;
  auVar2 = vfmsub213sd_fma(auVar3,auVar5,auVar6);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[0] = auVar1._0_8_ * 0.75;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[1] = (auVar2._0_8_ + -1.0) * this->m_lenX * 0.125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[2] = this->m_thicknessY * -0.25 * eta;
  auVar2 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar3,auVar3);
  auVar1 = vfmadd213sd_fma(auVar3,auVar5,auVar6);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[3] = this->m_thicknessZ * -0.25 * zeta;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[4] = auVar2._0_8_ * 0.75;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[5] = (auVar1._0_8_ + -1.0) * this->m_lenX * 0.125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[6] = this->m_thicknessY * 0.25 * eta;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.
  array[7] = this->m_thicknessZ * 0.25 * zeta;
  return;
}

Assistant:

void ChElementBeamANCF_3243::Calc_Sxi_xi_compact(VectorN& Sxi_xi_compact, double xi, double eta, double zeta) {
    Sxi_xi_compact(0) = 0.75 * (xi * xi - 1);
    Sxi_xi_compact(1) = 0.125 * m_lenX * (3 * xi * xi - 2 * xi - 1);
    Sxi_xi_compact(2) = -0.25 * m_thicknessY * eta;
    Sxi_xi_compact(3) = -0.25 * m_thicknessZ * zeta;
    Sxi_xi_compact(4) = 0.75 * (-xi * xi + 1);
    Sxi_xi_compact(5) = 0.125 * m_lenX * (3 * xi * xi + 2 * xi - 1);
    Sxi_xi_compact(6) = 0.25 * m_thicknessY * eta;
    Sxi_xi_compact(7) = 0.25 * m_thicknessZ * zeta;
}